

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_importcert(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  _func_char_ptr_uint *p_Var1;
  Tcl_Obj *pTVar2;
  Tcl_Obj *pTVar3;
  tclpkcs11_handle *handle;
  int iVar4;
  int iVar5;
  uchar *outbuf;
  unsigned_long buflen;
  Tcl_Obj *pTVar6;
  char *pcVar7;
  size_t sVar8;
  CK_SLOT_ID slot;
  CK_BYTE_PTR pCVar9;
  ProcErrorProc *pPVar10;
  CK_RV CVar11;
  long lVar12;
  CK_ULONG foundObjs;
  int tcl_keylist_llength;
  CK_OBJECT_HANDLE hObject;
  Tcl_Obj *local_3c0;
  CK_ATTRIBUTE attr_update [1];
  Tcl_Obj **tcl_keylist_values;
  CK_OBJECT_HANDLE pub_key;
  CK_ATTRIBUTE template [2];
  CK_ATTRIBUTE local_358;
  undefined8 local_340;
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 local_328;
  CK_BYTE_PTR local_320;
  unsigned_long uStack_318;
  undefined8 local_310;
  undefined1 *local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  size_t sStack_2d0;
  undefined8 local_2c8;
  void *local_2c0;
  unsigned_long uStack_2b8;
  undefined8 local_2b0;
  void *local_2a8;
  unsigned_long uStack_2a0;
  undefined8 local_298;
  uchar *local_290;
  unsigned_long uStack_288;
  undefined8 local_280;
  long *local_278;
  unsigned_long local_270;
  CK_MECHANISM mechanism_desc_sha1;
  CK_ULONG resultbuf_len;
  long serial_num;
  x509_object x509;
  
  pub_key = 0;
  local_278 = &serial_num;
  serial_num = 0;
  mechanism_desc_sha1.ulParameterLen = 0;
  local_358.type = 0;
  mechanism_desc_sha1.mechanism = 0x220;
  mechanism_desc_sha1.pParameter = (CK_VOID_PTR)0x0;
  local_358.pValue = &tclpkcs11_perform_pki_importcert_oclass_cert;
  local_358.ulValueLen = 8;
  local_340 = 0x80;
  local_338 = &tclpkcs11_perform_pki_importcert_ocert_type;
  local_330 = 8;
  local_328 = 0x102;
  local_320 = (CK_BYTE_PTR)0x0;
  uStack_318 = 0;
  local_310 = 1;
  local_308 = &tclpkcs11_perform_pki_importcert_ltrue;
  local_300 = 1;
  local_2f8 = 2;
  local_2f0 = &tclpkcs11_perform_pki_importcert_lfalse;
  local_2e8 = 1;
  local_2e0 = 3;
  local_2d8 = (char *)0x0;
  sStack_2d0 = 0;
  local_2c8 = 0x101;
  local_2c0 = (void *)0x0;
  uStack_2b8 = 0;
  local_2b0 = 0x81;
  local_2a8 = (void *)0x0;
  uStack_2a0 = 0;
  local_298 = 0x11;
  local_290 = (uchar *)0x0;
  uStack_288 = 0;
  local_280 = 0x82;
  local_270 = 8;
  template[0].pValue = (CK_VOID_PTR)0x0;
  template[1].pValue = (CK_VOID_PTR)0x0;
  template[1].ulValueLen = 0;
  template[0].ulValueLen = 0;
  template[1].type = 0;
  template[0].type = 0x102;
  attr_update[0].ulValueLen = 0;
  attr_update[0].type = 3;
  attr_update[0].pValue = (CK_VOID_PTR)0x0;
  if (objc == 3) {
    pTVar6 = objv[1];
    p_Var1 = tclStubsPtr->tcl_Alloc;
    iVar4 = (*tclStubsPtr->tcl_GetCharLength)(pTVar6);
    outbuf = (uchar *)(*p_Var1)(iVar4 / 2);
    iVar4 = (*tclStubsPtr->tcl_GetCharLength)(pTVar6);
    buflen = tclpkcs11_string_to_bytearray(pTVar6,outbuf,(long)(iVar4 / 2));
    iVar4 = asn1_x509_read_object(outbuf,buflen,&x509);
    if (iVar4 == -1) {
      pPVar10 = tclStubsPtr->tcl_SetObjResult;
      pcVar7 = "bad certificate";
    }
    else {
      local_2c0 = x509.subject.asn1rep;
      uStack_2b8 = x509.subject.asn1rep_len;
      local_2a8 = x509.issuer.asn1rep;
      uStack_2a0 = x509.issuer.asn1rep_len;
      local_278 = (long *)x509.serial_number.asn1rep;
      local_270 = x509.serial_number.asn1rep_len;
      pTVar6 = objv[2];
      local_290 = outbuf;
      uStack_288 = buflen;
      if (1 < pTVar6->refCount) {
        pTVar6 = (*tclStubsPtr->tcl_DuplicateObj)(pTVar6);
      }
      iVar4 = (*tclStubsPtr->tcl_ListObjGetElements)
                        ((Tcl_Interp_conflict *)interp,pTVar6,&tcl_keylist_llength,
                         &tcl_keylist_values);
      if (iVar4 != 0) {
        return iVar4;
      }
      if ((tcl_keylist_llength & 1U) == 0) {
        local_3c0 = (Tcl_Obj *)0x0;
        pTVar6 = (Tcl_Obj *)0x0;
        iVar4 = 0;
        for (lVar12 = 0; lVar12 < tcl_keylist_llength; lVar12 = lVar12 + 2) {
          pTVar2 = tcl_keylist_values[lVar12];
          pTVar3 = tcl_keylist_values[lVar12 + 1];
          pcVar7 = (*tclStubsPtr->tcl_GetString)(pTVar2);
          iVar5 = strcmp(pcVar7,"pkcs11_handle");
          if (iVar5 == 0) {
            iVar4 = iVar4 + 1;
            pTVar6 = pTVar3;
          }
          else {
            pcVar7 = (*tclStubsPtr->tcl_GetString)(pTVar2);
            iVar5 = strcmp(pcVar7,"pkcs11_slotid");
            if (iVar5 == 0) {
              iVar4 = iVar4 + 1;
              local_3c0 = pTVar3;
            }
            else {
              pcVar7 = (*tclStubsPtr->tcl_GetString)(pTVar2);
              iVar5 = strcmp(pcVar7,"pkcs11_label");
              if (iVar5 == 0) {
                local_2d8 = (*tclStubsPtr->tcl_GetString)(pTVar3);
                pcVar7 = (*tclStubsPtr->tcl_GetString)(pTVar3);
                sVar8 = strlen(pcVar7);
                sStack_2d0 = sVar8;
                attr_update[0].pValue = (*tclStubsPtr->tcl_GetString)(pTVar3);
                iVar4 = iVar4 + 1;
                attr_update[0].ulValueLen = sVar8;
              }
            }
          }
        }
        if (iVar4 != 3) {
          pPVar10 = tclStubsPtr->tcl_SetObjResult;
          pcVar7 = "invalid  handle or slot or param";
LAB_001078a8:
          pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar7,-1);
          goto LAB_001078d6;
        }
        lVar12 = (**(code **)((long)cd + 0x40))(cd,pTVar6);
        if ((lVar12 != 0) &&
           (handle = *(tclpkcs11_handle **)(lVar12 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
          pcVar7 = (*tclStubsPtr->tcl_GetString)(local_3c0);
          slot = atol(pcVar7);
          iVar4 = tclpkcs11_start_session(handle,slot);
          if (iVar4 == 0) {
            pCVar9 = (CK_BYTE_PTR)(*tclStubsPtr->tcl_Alloc)(0x14);
            template[0].ulValueLen = 0x14;
            template[0].pValue = pCVar9;
            CVar11 = (*handle->pkcs11->C_DigestInit)(handle->session,&mechanism_desc_sha1);
            if (CVar11 == 0) {
              resultbuf_len = 0x14;
              CVar11 = (*handle->pkcs11->C_Digest)
                                 (handle->session,(CK_BYTE_PTR)((long)x509.pubkey.contents + 1),
                                  x509.pubkey.size - 1,pCVar9,&resultbuf_len);
              if (CVar11 == 0) {
                uStack_318 = 0x14;
                template[1].pValue = &tclpkcs11_perform_pki_importcert_oclass_cert;
                template[1].ulValueLen = 8;
                local_320 = pCVar9;
                CVar11 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,template,2);
                if (CVar11 == 0) {
                  CVar11 = (*handle->pkcs11->C_FindObjects)(handle->session,&hObject,1,&foundObjs);
                  if (CVar11 != 0) {
                    pPVar10 = tclStubsPtr->tcl_SetObjResult;
                    pTVar6 = tclpkcs11_pkcs11_error(CVar11);
                    goto LAB_001079f1;
                  }
                  (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                  if (foundObjs != 0) {
                    pPVar10 = tclStubsPtr->tcl_SetObjResult;
                    pcVar7 = "Certificate with the CKA_ID exist";
                    goto LAB_001078ca;
                  }
                  CVar11 = (*handle->pkcs11->C_CreateObject)(handle->session,&local_358,10,&pub_key)
                  ;
                  if (CVar11 != 0) {
                    if (CVar11 == 0x101) {
                      pPVar10 = tclStubsPtr->tcl_SetObjResult;
                      pcVar7 = "importcert: cannot create object for certificate, not logged";
                    }
                    else {
                      pPVar10 = tclStubsPtr->tcl_SetObjResult;
                      pcVar7 = "importcert: cannot create object for certificate";
                    }
                    goto LAB_001078a8;
                  }
                  template[1].pValue = &tclpkcs11_perform_pki_importcert_oclass_pub;
                  template[1].ulValueLen = 8;
                  CVar11 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,template,2);
                  if (CVar11 == 0) {
                    CVar11 = (*handle->pkcs11->C_FindObjects)(handle->session,&hObject,1,&foundObjs)
                    ;
                    if (CVar11 == 0) {
                      (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                      if (foundObjs == 1) {
                        (*handle->pkcs11->C_SetAttributeValue)
                                  (handle->session,hObject,attr_update,1);
                      }
                      template[1].pValue = &tclpkcs11_perform_pki_importcert_oclass_priv;
                      template[1].ulValueLen = 8;
                      CVar11 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,template,2);
                      if (CVar11 != 0) goto LAB_00107aac;
                      CVar11 = (*handle->pkcs11->C_FindObjects)
                                         (handle->session,&hObject,1,&foundObjs);
                      if (CVar11 == 0) {
                        (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                        if (foundObjs == 1) {
                          (*handle->pkcs11->C_SetAttributeValue)
                                    (handle->session,hObject,attr_update,1);
                        }
                        pTVar6 = tclpkcs11_bytearray_to_string(local_320,uStack_318);
                        (*tclStubsPtr->tcl_Free)((char *)local_320);
                        (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar6);
                        return 0;
                      }
                    }
                    pPVar10 = tclStubsPtr->tcl_SetObjResult;
                    pTVar6 = tclpkcs11_pkcs11_error(CVar11);
LAB_001079f1:
                    (*pPVar10)((Tcl_Interp_conflict *)interp,pTVar6);
                    (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                    return 1;
                  }
LAB_00107aac:
                  pPVar10 = tclStubsPtr->tcl_SetObjResult;
                  pTVar6 = tclpkcs11_pkcs11_error(CVar11);
                  goto LAB_001078d6;
                }
              }
            }
            pPVar10 = tclStubsPtr->tcl_SetObjResult;
          }
          else {
            CVar11 = (CK_RV)iVar4;
            pPVar10 = tclStubsPtr->tcl_SetObjResult;
          }
          pTVar6 = tclpkcs11_pkcs11_error(CVar11);
          goto LAB_001078d6;
        }
        pPVar10 = tclStubsPtr->tcl_SetObjResult;
        pcVar7 = "invalid handle";
      }
      else {
        pPVar10 = tclStubsPtr->tcl_SetObjResult;
        pcVar7 = "list must have an even number of elements";
      }
    }
  }
  else {
    pPVar10 = tclStubsPtr->tcl_SetObjResult;
    pcVar7 = "wrong # args: should be \"pki::pkcs11::importcert cert_der_hex list_token_and_cka\"";
  }
LAB_001078ca:
  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar7,-1);
LAB_001078d6:
  (*pPVar10)((Tcl_Interp_conflict *)interp,pTVar6);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_importcert(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "ImportCert START\n");
  return(tclpkcs11_perform_pki_importcert(cd, interp, objc, objv));
}